

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

uint __thiscall LinearScan::GetRemainingHelperLength(LinearScan *this,Lifetime *lifetime)

{
  uint32 uVar1;
  Instr *this_00;
  code *pcVar2;
  SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *this_01;
  bool bVar3;
  IRKind IVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  uint *puVar7;
  Type_conflict node;
  bool local_75;
  uint32 local_64;
  uint32 local_60;
  uint32 local_5c;
  uint helperEnd;
  uint helperStart;
  OpHelperBlock *helper;
  undefined1 auStack_48 [4];
  uint end;
  Iterator it;
  uint helperLength;
  Lifetime *lifetime_local;
  LinearScan *this_local;
  
  it.current._4_4_ = 0;
  _auStack_48 = (this->opHelperBlockIter).list;
  it.list = (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)
            (this->opHelperBlockIter).current;
  bVar3 = SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::Iterator::IsValid
                    ((Iterator *)auStack_48);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x11e6,"(it.IsValid())","it.IsValid()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  helper._0_4_ = IR::Instr::GetNumber(this->currentInstr);
  puVar7 = max<unsigned_int>((uint *)&helper,&lifetime->end);
  helper._4_4_ = *puVar7;
  do {
    _helperEnd = SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)auStack_48);
    local_5c = IR::Instr::GetNumber(&_helperEnd->opHelperLabel->super_Instr);
    if (helper._4_4_ < local_5c) {
      return it.current._4_4_;
    }
    local_64 = IR::Instr::GetNumber(_helperEnd->opHelperEndInstr);
    puVar7 = min<unsigned_int>((uint *)((long)&helper + 4),&local_64);
    uVar1 = *puVar7;
    it.current._4_4_ = (uVar1 - local_5c) + it.current._4_4_;
    local_60 = uVar1;
    uVar5 = IR::Instr::GetNumber(_helperEnd->opHelperEndInstr);
    if (uVar1 == uVar5) {
      this_00 = _helperEnd->opHelperEndInstr;
      IVar4 = IR::Instr::GetKind(this_00);
      local_75 = true;
      if (IVar4 != InstrKindLabel) {
        local_75 = IR::Instr::IsProfiledLabelInstr(this_00);
      }
      if (local_75 == false) goto LAB_00771084;
    }
    else {
LAB_00771084:
      it.current._4_4_ = it.current._4_4_ + 1;
    }
    if (it.list == (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    this_01 = _auStack_48;
    node = SListNodeBase<Memory::ArenaAllocator>::Next
                     (&(it.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar3 = SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::IsHead(this_01,node);
    if (bVar3) {
      return it.current._4_4_;
    }
    it.list = (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)
              SListNodeBase<Memory::ArenaAllocator>::Next
                        (&(it.list)->super_SListNodeBase<Memory::ArenaAllocator>);
  } while( true );
}

Assistant:

uint LinearScan::GetRemainingHelperLength(Lifetime *const lifetime)
{
    // Walk the helper block linked list starting from the next helper block until the end of the lifetime
    uint helperLength = 0;
    SList<OpHelperBlock>::Iterator it(opHelperBlockIter);
    Assert(it.IsValid());
    const uint end = max(currentInstr->GetNumber(), lifetime->end);
    do
    {
        const OpHelperBlock &helper = it.Data();
        const uint helperStart = helper.opHelperLabel->GetNumber();
        if(helperStart > end)
        {
            break;
        }

        const uint helperEnd = min(end, helper.opHelperEndInstr->GetNumber());
        helperLength += helperEnd - helperStart;
        if(helperEnd != helper.opHelperEndInstr->GetNumber() || !helper.opHelperEndInstr->IsLabelInstr())
        {
            // A helper block that ends at a label does not return to the function. Since this helper block does not end
            // at a label, include the end instruction as well.
            ++helperLength;
        }
    } while(it.Next());

    return helperLength;
}